

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

ostream_inserter
pstore::to_base64<unsigned_char_const*,pstore::exchange::export_ns::ostream_inserter>
          (uchar *first,uchar *last,ostream_inserter out)

{
  byte bVar1;
  char cVar2;
  const_reference pvVar3;
  ostream_inserter *poVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  ostream_inserter local_b0;
  ostream_inserter local_a8;
  ostream_inserter local_a0;
  ostream_inserter local_98;
  uint local_8c;
  ostream_inserter oStack_88;
  uint32_t value3;
  ostream_inserter local_80;
  ostream_inserter local_78;
  ostream_inserter local_70;
  uint local_64;
  ostream_inserter oStack_60;
  uint32_t value2;
  ostream_inserter local_58;
  ostream_inserter local_50;
  ostream_inserter local_48;
  uint local_3c;
  long lStack_38;
  uint32_t value1;
  difference_type index;
  difference_type size;
  uchar *last_local;
  uchar *first_local;
  ostream_inserter out_local;
  
  size = (difference_type)last;
  last_local = first;
  first_local = (uchar *)out.os_;
  index = std::distance<unsigned_char_const*>(first,last);
  for (lStack_38 = 0; lStack_38 < index / 3; lStack_38 = lStack_38 + 1) {
    pbVar6 = last_local + 1;
    bVar1 = *last_local;
    pbVar7 = last_local + 2;
    last_local = last_local + 3;
    local_3c = (uint)*pbVar7 + (uint)*pbVar6 * 0x100 + (uint)bVar1 * 0x10000;
    pvVar3 = std::array<char,_64UL>::operator[]
                       (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                         ::alphabet,(ulong)((local_3c & 0xfc0000) >> 0x12));
    cVar2 = *pvVar3;
    local_48 = exchange::export_ns::ostream_inserter::operator++((ostream_inserter *)&first_local,0)
    ;
    poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_48);
    exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
    pvVar3 = std::array<char,_64UL>::operator[]
                       (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                         ::alphabet,(ulong)((local_3c & 0x3f000) >> 0xc));
    cVar2 = *pvVar3;
    local_50 = exchange::export_ns::ostream_inserter::operator++((ostream_inserter *)&first_local,0)
    ;
    poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_50);
    exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
    pvVar3 = std::array<char,_64UL>::operator[]
                       (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                         ::alphabet,(ulong)((local_3c & 0xfc0) >> 6));
    cVar2 = *pvVar3;
    local_58 = exchange::export_ns::ostream_inserter::operator++((ostream_inserter *)&first_local,0)
    ;
    poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_58);
    exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
    pvVar3 = std::array<char,_64UL>::operator[]
                       (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                         ::alphabet,(ulong)(local_3c & 0x3f));
    cVar2 = *pvVar3;
    oStack_60 = exchange::export_ns::ostream_inserter::operator++
                          ((ostream_inserter *)&first_local,0);
    poVar4 = exchange::export_ns::ostream_inserter::operator*(&stack0xffffffffffffffa0);
    exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
  }
  lVar5 = index % 3;
  if (lVar5 != 0) {
    if (lVar5 == 1) {
      local_64 = (uint)*last_local << 0x10;
      last_local = last_local + 1;
      pvVar3 = std::array<char,_64UL>::operator[]
                         (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                           ::alphabet,(ulong)(local_64 >> 0x12));
      cVar2 = *pvVar3;
      local_70 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_70);
      exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
      pvVar3 = std::array<char,_64UL>::operator[]
                         (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                           ::alphabet,(ulong)((local_64 & 0x3f000) >> 0xc));
      cVar2 = *pvVar3;
      local_78 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_78);
      exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
      local_80 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_80);
      exchange::export_ns::ostream_inserter::operator=(poVar4,'=');
      oStack_88 = exchange::export_ns::ostream_inserter::operator++
                            ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&stack0xffffffffffffff78);
      exchange::export_ns::ostream_inserter::operator=(poVar4,'=');
    }
    else {
      if (lVar5 != 2) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                      ,0x4e);
      }
      pbVar6 = last_local + 1;
      bVar1 = *last_local;
      last_local = last_local + 2;
      local_8c = (uint)*pbVar6 * 0x100 + (uint)bVar1 * 0x10000;
      pvVar3 = std::array<char,_64UL>::operator[]
                         (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                           ::alphabet,(ulong)((local_8c & 0xfc0000) >> 0x12));
      cVar2 = *pvVar3;
      local_98 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_98);
      exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
      pvVar3 = std::array<char,_64UL>::operator[]
                         (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                           ::alphabet,(ulong)((local_8c & 0x3f000) >> 0xc));
      cVar2 = *pvVar3;
      local_a0 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_a0);
      exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
      pvVar3 = std::array<char,_64UL>::operator[]
                         (&to_base64<const_unsigned_char_*,_pstore::exchange::export_ns::ostream_inserter>
                           ::alphabet,(ulong)((local_8c & 0xfc0) >> 6));
      cVar2 = *pvVar3;
      local_a8 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_a8);
      exchange::export_ns::ostream_inserter::operator=(poVar4,cVar2);
      local_b0 = exchange::export_ns::ostream_inserter::operator++
                           ((ostream_inserter *)&first_local,0);
      poVar4 = exchange::export_ns::ostream_inserter::operator*(&local_b0);
      exchange::export_ns::ostream_inserter::operator=(poVar4,'=');
    }
  }
  if (last_local != (uchar *)size) {
    assert_failed("first == last",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                  ,0x51);
  }
  return (ostream_inserter)(ostream_base *)first_local;
}

Assistant:

OutputIterator to_base64 (ForwardIterator first, ForwardIterator last, OutputIterator out) {
        static constexpr std::array<char, 64> alphabet{
            {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P',
             'Q', 'R', 'S', 'T', 'U', 'V', 'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f',
             'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r', 's', 't', 'u', 'v',
             'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'}};
        auto const size = std::distance (first, last);
        // Consume the input, converting three input bytes to four output characters.
        for (auto index = decltype (size){0}; index < size / 3; ++index) {
            auto value1 = static_cast<std::uint32_t> (*(first++) << 16);
            value1 += static_cast<std::uint32_t> (*(first++) << 8);
            value1 += static_cast<std::uint32_t> (*(first++));

            *(out++) = alphabet[(value1 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value1 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value1 & 0x00000FC0) >> 6];
            *(out++) = alphabet[value1 & 0x0000003F];
        }

        // Deal with the remaining 0..2 characters.
        switch (size % 3) {
        case 0: break;
        case 1: {
            auto const value2 = static_cast<std::uint32_t> (*(first++) << 16);

            *(out++) = alphabet[(value2 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value2 & 0x0003F000) >> 12];
            *(out++) = '=';
            *(out++) = '=';
        } break;
        case 2: {
            auto value3 = static_cast<std::uint32_t> (*(first++) << 16);
            value3 += static_cast<std::uint32_t> (*(first++) << 8);

            *(out++) = alphabet[(value3 & 0x00FC0000) >> 18];
            *(out++) = alphabet[(value3 & 0x0003F000) >> 12];
            *(out++) = alphabet[(value3 & 0x00000FC0) >> 6];
            *(out++) = '=';
        } break;
        default:
            PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about a conditional constant)
            break;
        }
        PSTORE_ASSERT (first == last);
        return out;
    }